

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

ShuffleVectorInst * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::ShuffleVectorInst,LLVMBC::VectorType*&,LLVMBC::Value*&,LLVMBC::Value*&,LLVMBC::Value*&>
          (LLVMContext *this,VectorType **u,Value **u_1,Value **u_2,Value **u_3)

{
  ShuffleVectorInst *this_00;
  
  this_00 = (ShuffleVectorInst *)allocate(this,0x88,8);
  if (this_00 != (ShuffleVectorInst *)0x0) {
    ShuffleVectorInst::ShuffleVectorInst(this_00,&(*u)->super_Type,*u_1,*u_2,*u_3);
    append_typed_destructor<LLVMBC::ShuffleVectorInst>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}